

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void print_by_lines(char *message,char *prefix)

{
  char *pcVar1;
  
  if ((message != (char *)0x0) && (*message != '\0')) {
    pcVar1 = pcut_str_find_char(message,'\n');
    while (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
      printf("%s%s\n",prefix,message);
      message = pcVar1 + 1;
      pcVar1 = pcut_str_find_char(message,'\n');
    }
    if (*message != '\0') {
      printf("%s%s\n",prefix,message);
      return;
    }
  }
  return;
}

Assistant:

static void print_by_lines(const char *message, const char *element_name) {
	char *next_line_start;

	if ((message == NULL) || (message[0] == 0)) {
		return;
	}

	printf("\t\t\t<%s><![CDATA[", element_name);

	next_line_start = pcut_str_find_char(message, '\n');
	while (next_line_start != NULL) {
		next_line_start[0] = 0;
		printf("%s\n", message);
		message = next_line_start + 1;
		next_line_start = pcut_str_find_char(message, '\n');
	}
	if (message[0] != 0) {
		printf("%s\n", message);
	}

	printf("]]></%s>\n", element_name);
}